

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeCall
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name func,bool isReturn)

{
  Name target;
  Function *this_00;
  size_t size;
  Call *pCVar1;
  bool bVar2;
  Ok local_121;
  uintptr_t local_120;
  MixedArena *local_118;
  size_t local_110;
  uint local_104;
  Err local_100;
  Err *local_d0;
  Err *err;
  Result<wasm::Ok> _val;
  Call curr;
  undefined1 local_40 [8];
  Signature sig;
  bool isReturn_local;
  IRBuilder *this_local;
  Name func_local;
  
  func_local.super_IString.str._M_len = func.super_IString.str._M_str;
  curr._64_8_ = func.super_IString.str._M_len;
  sig.results.id._7_1_ = isReturn;
  this_local = (IRBuilder *)curr._64_8_;
  func_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  this_00 = Module::getFunction(this->wasm,func);
  _local_40 = Function::getSig(this_00);
  pCVar1 = (Call *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  Call::Call(pCVar1,&this->wasm->allocator);
  wasm::Name::operator=((Name *)&curr.operands.allocator,(Name *)&this_local);
  size = wasm::Type::size((Type *)local_40);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             &curr.super_SpecificExpression<(wasm::Expression::Id)6>.super_Expression.type,size);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitCall
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pCVar1);
  local_d0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_d0 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_100,local_d0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_100);
    wasm::Err::~Err(&local_100);
  }
  local_104 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_104 == 0) {
    local_118 = curr.operands.allocator;
    local_110 = curr.target.super_IString.str._M_len;
    local_120 = sig.params.id;
    target.super_IString.str._M_str = (char *)curr.target.super_IString.str._M_len;
    target.super_IString.str._M_len = (size_t)curr.operands.allocator;
    pCVar1 = Builder::makeCall<ArenaVector<wasm::Expression*>>
                       (&this->builder,target,
                        (ArenaVector<wasm::Expression_*> *)
                        &curr.super_SpecificExpression<(wasm::Expression::Id)6>.super_Expression.
                         type,sig.params,(bool)(sig.results.id._7_1_ & 1));
    push(this,(Expression *)pCVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_121);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeCall(Name func, bool isReturn) {
  auto sig = wasm.getFunction(func)->getSig();
  Call curr(wasm.allocator);
  curr.target = func;
  curr.operands.resize(sig.params.size());
  CHECK_ERR(visitCall(&curr));
  push(builder.makeCall(curr.target, curr.operands, sig.results, isReturn));
  return Ok{};
}